

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,double,duckdb::NotEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  const_reference pvVar3;
  ulong uVar4;
  idx_t iVar5;
  SelectionVector *pSVar6;
  ulong uVar7;
  ulong uVar8;
  uchar **rhs_locations;
  idx_t entry_idx;
  bool bVar9;
  value_type rhs_offset_in_row;
  SelectionVector *lhs_sel;
  idx_t local_68;
  double local_60;
  uint local_54;
  data_ptr_t local_50;
  ulong local_48;
  value_type local_40;
  SelectionVector *local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_38 = (lhs_format->unified).sel;
  local_50 = (lhs_format->unified).data;
  pdVar2 = rhs_row_locations->data;
  pvVar3 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  local_40 = *pvVar3;
  local_48 = count;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = 0;
      uVar7 = 0;
      do {
        uVar8 = uVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar7];
        }
        uVar4 = uVar8;
        if (local_38->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)local_38->sel_vector[uVar8];
        }
        local_60 = *(double *)(*(long *)(pdVar2 + uVar8 * 8) + local_40);
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar2 + uVar8 * 8) + (col_idx >> 3))) == 0) ||
           (bVar9 = Equals::Operation<double>((double *)(local_50 + uVar4 * 8),&local_60),
           count = local_48, bVar9)) {
          iVar5 = *no_match_count;
          *no_match_count = iVar5 + 1;
          pSVar6 = no_match_sel;
        }
        else {
          iVar5 = local_68;
          pSVar6 = sel;
          local_68 = local_68 + 1;
        }
        pSVar6->sel_vector[iVar5] = (sel_t)uVar8;
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
      return local_68;
    }
  }
  else if (count != 0) {
    local_54 = 1 << ((byte)col_idx & 7);
    local_68 = 0;
    uVar7 = 0;
    do {
      uVar8 = uVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)sel->sel_vector[uVar7];
      }
      uVar4 = uVar8;
      if (local_38->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)local_38->sel_vector[uVar8];
      }
      puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar9 = false;
      }
      else {
        bVar9 = (puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0;
      }
      local_60 = *(double *)(*(long *)(pdVar2 + uVar8 * 8) + local_40);
      if (((bVar9) || ((*(byte *)(*(long *)(pdVar2 + uVar8 * 8) + (col_idx >> 3)) & local_54) == 0))
         || (bVar9 = Equals::Operation<double>((double *)(local_50 + uVar4 * 8),&local_60),
            count = local_48, bVar9)) {
        iVar5 = *no_match_count;
        *no_match_count = iVar5 + 1;
        pSVar6 = no_match_sel;
      }
      else {
        iVar5 = local_68;
        pSVar6 = sel;
        local_68 = local_68 + 1;
      }
      pSVar6->sel_vector[iVar5] = (sel_t)uVar8;
      uVar7 = uVar7 + 1;
    } while (count != uVar7);
    return local_68;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}